

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall jsonnet::internal::CompilerPass::fields(CompilerPass *this,ObjectFields *fields)

{
  pointer pOVar1;
  Fodder *pFVar2;
  ObjectField *field;
  pointer pOVar3;
  AST **ppAVar4;
  
  pOVar3 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pOVar3 == pOVar1) {
      return;
    }
    switch(pOVar3->kind) {
    case ASSERT:
      (*this->_vptr_CompilerPass[1])(this,&pOVar3->fodder1);
      (*this->_vptr_CompilerPass[6])(this,&pOVar3->expr2);
      if (pOVar3->expr3 == (AST *)0x0) goto switchD_00193302_default;
      ppAVar4 = &pOVar3->expr3;
      (*this->_vptr_CompilerPass[1])(this,&pOVar3->opFodder);
      goto LAB_001933b6;
    case FIELD_ID:
      pFVar2 = &pOVar3->fodder1;
      goto LAB_0019338a;
    case FIELD_EXPR:
      (*this->_vptr_CompilerPass[1])(this,&pOVar3->fodder1);
      (*this->_vptr_CompilerPass[6])(this,&pOVar3->expr1);
      break;
    case FIELD_STR:
      (*this->_vptr_CompilerPass[6])(this,&pOVar3->expr1);
      goto LAB_00193393;
    case LOCAL:
      (*this->_vptr_CompilerPass[1])(this,&pOVar3->fodder1);
      break;
    default:
      goto switchD_00193302_default;
    }
    pFVar2 = &pOVar3->fodder2;
LAB_0019338a:
    (*this->_vptr_CompilerPass[1])(this,pFVar2);
LAB_00193393:
    (*this->_vptr_CompilerPass[4])(this,pOVar3);
    (*this->_vptr_CompilerPass[1])(this,&pOVar3->opFodder);
    ppAVar4 = &pOVar3->expr2;
LAB_001933b6:
    (*this->_vptr_CompilerPass[6])(this,ppAVar4);
switchD_00193302_default:
    (*this->_vptr_CompilerPass[1])(this,&pOVar3->commaFodder);
    pOVar3 = pOVar3 + 1;
  } while( true );
}

Assistant:

void CompilerPass::fields(ObjectFields &fields)
{
    for (auto &field : fields) {
        switch (field.kind) {
            case ObjectField::LOCAL: {
                fodder(field.fodder1);
                fodder(field.fodder2);
                fieldParams(field);
                fodder(field.opFodder);
                expr(field.expr2);
            } break;

            case ObjectField::FIELD_ID:
            case ObjectField::FIELD_STR:
            case ObjectField::FIELD_EXPR: {
                if (field.kind == ObjectField::FIELD_ID) {
                    fodder(field.fodder1);

                } else if (field.kind == ObjectField::FIELD_STR) {
                    expr(field.expr1);

                } else if (field.kind == ObjectField::FIELD_EXPR) {
                    fodder(field.fodder1);
                    expr(field.expr1);
                    fodder(field.fodder2);
                }
                fieldParams(field);
                fodder(field.opFodder);
                expr(field.expr2);

            } break;

            case ObjectField::ASSERT: {
                fodder(field.fodder1);
                expr(field.expr2);
                if (field.expr3 != nullptr) {
                    fodder(field.opFodder);
                    expr(field.expr3);
                }
            } break;
        }

        fodder(field.commaFodder);
    }
}